

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl-ssl.c
# Opt level: O1

void lws_ssl_destroy_client_ctx(lws_vhost *vhost)

{
  int *piVar1;
  SSL_CTX *ssl;
  void *ptr;
  
  if ((((vhost->tls).field_0x64 & 1) == 0) &&
     (ssl = (SSL_CTX *)(vhost->tls).ssl_client_ctx, ssl != (SSL_CTX *)0x0)) {
    ptr = SSL_CTX_get_ex_data(ssl,openssl_SSL_CTX_private_data_index);
    if (ptr != (void *)0x0) {
      piVar1 = (int *)((long)ptr + 0x40);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        SSL_CTX_free((SSL_CTX *)(vhost->tls).ssl_client_ctx);
        (vhost->tls).ssl_client_ctx = (lws_tls_ctx *)0x0;
        piVar1 = &(vhost->context->tls).count_client_contexts;
        *piVar1 = *piVar1 + -1;
        lws_dll2_remove((lws_dll2 *)((long)ptr + 0x28));
        lws_realloc(ptr,0,"lws_free");
        return;
      }
    }
  }
  return;
}

Assistant:

static void
lws_ssl_destroy_client_ctx(struct lws_vhost *vhost)
{
	struct lws_tls_client_reuse *tcr;

	if (vhost->tls.user_supplied_ssl_ctx || !vhost->tls.ssl_client_ctx)
		return;

	tcr = SSL_CTX_get_ex_data(vhost->tls.ssl_client_ctx,
				  openssl_SSL_CTX_private_data_index);

	if (!tcr || --tcr->refcount)
		return;

	SSL_CTX_free(vhost->tls.ssl_client_ctx);
	vhost->tls.ssl_client_ctx = NULL;

	vhost->context->tls.count_client_contexts--;

	lws_dll2_remove(&tcr->cc_list);
	lws_free(tcr);
}